

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP.cpp
# Opt level: O3

object get_token(SRUP_MSG *self)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  PyObject *pPVar3;
  SRUP_MSG *in_RSI;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  puVar2 = SRUP_MSG::token(in_RSI);
  if (puVar2 == (uint8_t *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    self->_vptr_SRUP_MSG = (_func_int **)&_Py_NoneStruct;
  }
  else {
    uVar1 = SRUP_MSG::token_length(in_RSI);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,puVar2,puVar2 + uVar1);
    pPVar3 = boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                       ((string *)local_40);
    self->_vptr_SRUP_MSG = (_func_int **)pPVar3;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_token(SRUP_MSG& self)
{
    const uint8_t* rv;
    rv = self.token();
    if (rv!=nullptr)
        return boost::python::object(std::string((char*)rv, self.token_length()));
    else
        return boost::python::object();
}